

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_by_mmuidx_all_cpus_synced_aarch64
               (CPUState *src_cpu,target_ulong addr,uint16_t idxmap)

{
  ulong uVar1;
  run_on_cpu_data data;
  int iVar2;
  TLBFlushPageByMMUIdxData *d;
  uc_struct_conflict2 *uc;
  uint16_t idxmap_local;
  target_ulong addr_local;
  CPUState *src_cpu_local;
  
  uVar1 = *(ulong *)&src_cpu->uc->init_target_page->mask & addr;
  iVar2 = (int)*(undefined8 *)&src_cpu->uc->init_target_page->mask;
  if (SBORROW4((uint)idxmap,-iVar2) == (int)((uint)idxmap + iVar2) < 0) {
    data.host_ptr = g_malloc_n(1,0x10);
    *(ulong *)data.host_ptr = uVar1;
    *(uint16_t *)(data.host_ulong + 8) = idxmap;
    tlb_flush_page_by_mmuidx_async_2(src_cpu,data);
  }
  else {
    flush_all_helper(src_cpu,tlb_flush_page_by_mmuidx_async_1,(run_on_cpu_data)(uVar1 | idxmap));
    tlb_flush_page_by_mmuidx_async_1(src_cpu,(run_on_cpu_data)(uVar1 | idxmap));
  }
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx_all_cpus_synced(CPUState *src_cpu,
                                              target_ulong addr,
                                              uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = src_cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    /*
     * Allocate memory to hold addr+idxmap only when needed.
     * See tlb_flush_page_by_mmuidx for details.
     */
    if (idxmap < TARGET_PAGE_SIZE) {
        flush_all_helper(src_cpu, tlb_flush_page_by_mmuidx_async_1,
                         RUN_ON_CPU_TARGET_PTR(addr | idxmap));
        tlb_flush_page_by_mmuidx_async_1(src_cpu, RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
        //CPUState *dst_cpu;
        TLBFlushPageByMMUIdxData *d;

#if 0
        /* Allocate a separate data block for each destination cpu.  */
        CPU_FOREACH(dst_cpu) {
            if (dst_cpu != src_cpu) {
                d = g_new(TLBFlushPageByMMUIdxData, 1);
                d->addr = addr;
                d->idxmap = idxmap;
                tlb_flush_page_by_mmuidx_async_2(dst_cpu, RUN_ON_CPU_HOST_PTR(d));
            }
        }
#endif

        d = g_new(TLBFlushPageByMMUIdxData, 1);
        d->addr = addr;
        d->idxmap = idxmap;
        tlb_flush_page_by_mmuidx_async_2(src_cpu, RUN_ON_CPU_HOST_PTR(d));
    }
}